

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::IntConstOpnd::IsEqualInternal(IntConstOpnd *this,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  Opnd *opnd_local;
  IntConstOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x5d5,"(m_kind == OpndKindIntConst)","m_kind == OpndKindIntConst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = Opnd::IsIntConstOpnd(opnd);
  if (bVar3) {
    IVar4 = Opnd::GetType(&this->super_Opnd);
    IVar5 = Opnd::GetType(opnd);
    if (IVar4 == IVar5) {
      lVar1 = (this->super_EncodableOpnd<long>).m_value;
      pIVar7 = Opnd::AsIntConstOpnd(opnd);
      return lVar1 == (pIVar7->super_EncodableOpnd<long>).m_value;
    }
  }
  return false;
}

Assistant:

bool
IntConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindIntConst);
    if (!opnd->IsIntConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsIntConstOpnd()->m_value;
}